

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_array(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQObjectValue this;
  SQObjectPtr local_28;
  
  pSVar2 = stack_get(v,2);
  SVar3 = sq_gettop(v);
  if (SVar3 < 3) {
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (pSVar2->super_SQObject)._unVal.nInteger;
    }
    this.pArray = SQArray::Create(v->_sharedstate,SVar3);
  }
  else {
    this.pArray = SQArray::Create(v->_sharedstate,0);
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (pSVar2->super_SQObject)._unVal.nInteger;
    }
    pSVar2 = stack_get(v,3);
    SQArray::Resize(this.pArray,SVar3,pSVar2);
  }
  local_28.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_28.super_SQObject._unVal = this;
  SQVM::Push(v,&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  return 1;
}

Assistant:

static SQInteger base_array(HSQUIRRELVM v)
{
    SQArray *a;
    SQObject &size = stack_get(v,2);
    if(sq_gettop(v) > 2) {
        a = SQArray::Create(_ss(v),0);
        a->Resize(tointeger(size),stack_get(v,3));
    }
    else {
        a = SQArray::Create(_ss(v),tointeger(size));
    }
    v->Push(a);
    return 1;
}